

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O2

int ldhsecret(lua_State *L)

{
  int iVar1;
  uint64_t r;
  uint32_t y [2];
  uint32_t x [2];
  
  read64(L,x,y);
  if ((x != (uint32_t  [2])0x0) && (y != (uint32_t  [2])0x0)) {
    r = powmodp((uint64_t)x,(uint64_t)y);
    push64(L,r);
    return 1;
  }
  iVar1 = luaL_error(L,"Can\'t be 0");
  return iVar1;
}

Assistant:

static int
ldhsecret(lua_State *L) {
	uint32_t x[2], y[2];
	read64(L, x, y);
	uint64_t xx = (uint64_t)x[0] | (uint64_t)x[1]<<32;
	uint64_t yy = (uint64_t)y[0] | (uint64_t)y[1]<<32;
	if (xx == 0 || yy == 0)
		return luaL_error(L, "Can't be 0");
	uint64_t r = powmodp(xx, yy);

	push64(L, r);

	return 1;
}